

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_mfcc_dct3(fe_t *fe,mfcc_t *fr_cep,mfcc_t *fr_spec)

{
  powspec_t *mflogspec;
  int local_2c;
  int32 i;
  powspec_t *powspec;
  mfcc_t *fr_spec_local;
  mfcc_t *fr_cep_local;
  fe_t *fe_local;
  
  mflogspec = (powspec_t *)
              __ckd_malloc__((long)fe->mel_fb->num_filters << 3,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                             ,0x2a1);
  fe_dct3(fe,fr_cep,mflogspec);
  for (local_2c = 0; local_2c < fe->mel_fb->num_filters; local_2c = local_2c + 1) {
    fr_spec[local_2c] = (mfcc_t)(float)(double)mflogspec[local_2c];
  }
  ckd_free(mflogspec);
  return 0;
}

Assistant:

int32
fe_mfcc_dct3(fe_t * fe, const mfcc_t * fr_cep, mfcc_t * fr_spec)
{
#ifdef FIXED_POINT
    fe_dct3(fe, fr_cep, fr_spec);
#else                           /* ! FIXED_POINT */
    powspec_t *powspec;
    int32 i;

    powspec = ckd_malloc(fe->mel_fb->num_filters * sizeof(powspec_t));
    fe_dct3(fe, fr_cep, powspec);
    for (i = 0; i < fe->mel_fb->num_filters; ++i)
        fr_spec[i] = (mfcc_t) powspec[i];
    ckd_free(powspec);
#endif                          /* ! FIXED_POINT */
    return 0;
}